

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall
QList<QToolBarAreaLayoutLine>::remove(QList<QToolBarAreaLayoutLine> *this,char *__filename)

{
  QList<QToolBarAreaLayoutLine> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  QToolBarAreaLayoutLine *in_stack_00000018;
  QMovableArrayOps<QToolBarAreaLayoutLine> *in_stack_00000020;
  QArrayDataPointer<QToolBarAreaLayoutLine> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<QToolBarAreaLayoutLine>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<QToolBarAreaLayoutLine>::operator->(&this->d);
    QArrayDataPointer<QToolBarAreaLayoutLine>::operator->(&this->d);
    QArrayDataPointer<QToolBarAreaLayoutLine>::begin
              ((QArrayDataPointer<QToolBarAreaLayoutLine> *)0x6fa869);
    QtPrivate::QMovableArrayOps<QToolBarAreaLayoutLine>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}